

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O2

void add_quad(double x,double y,double z,double u,double v,double ux,double uy,double uz,double uu,
             double uv,double vx,double vy,double vz,double vu,double vv,ALLEGRO_COLOR c1,
             ALLEGRO_COLOR c2)

{
  double x_00;
  double y_00;
  double z_00;
  double u_00;
  double v_00;
  ALLEGRO_COLOR color;
  ALLEGRO_COLOR color_00;
  ALLEGRO_COLOR color_01;
  ALLEGRO_COLOR color_02;
  ALLEGRO_COLOR color_03;
  ALLEGRO_COLOR color_04;
  
  color._8_8_ = vz;
  color._0_8_ = vy;
  add_vertex(x,y,z,u,v,color);
  x_00 = ux + x;
  y_00 = y + 0.0;
  z_00 = uy + z;
  u_00 = uz + u;
  v_00 = v + 0.0;
  color_00._8_8_ = vz;
  color_00._0_8_ = vy;
  add_vertex(x_00,y_00,z_00,u_00,v_00,color_00);
  color_01._8_8_ = vv;
  color_01._0_8_ = vu;
  add_vertex(x + 0.0,y + uu,z + uv,u + 0.0,v + vx,color_01);
  color_02._8_8_ = vv;
  color_02._0_8_ = vu;
  add_vertex(x + 0.0,y + uu,z + uv,u + 0.0,v + vx,color_02);
  color_03._8_8_ = vz;
  color_03._0_8_ = vy;
  add_vertex(x_00,y_00,z_00,u_00,v_00,color_03);
  color_04._8_8_ = vv;
  color_04._0_8_ = vu;
  add_vertex(x_00 + 0.0,y_00 + uu,z_00 + uv,u_00 + 0.0,v_00 + vx,color_04);
  return;
}

Assistant:

static void add_quad(double x, double y, double z, double u, double v,
   double ux, double uy, double uz, double uu, double uv,
   double vx, double vy, double vz, double vu, double vv,
   ALLEGRO_COLOR c1, ALLEGRO_COLOR c2)
{
   add_vertex(x, y, z, u, v, c1);
   add_vertex(x + ux, y + uy, z + uz, u + uu, v + uv, c1);
   add_vertex(x + vx, y + vy, z + vz, u + vu, v + vv, c2);
   add_vertex(x + vx, y + vy, z + vz, u + vu, v + vv, c2);
   add_vertex(x + ux, y + uy, z + uz, u + uu, v + uv, c1);
   add_vertex(x + ux + vx, y + uy + vy, z + uz + vz, u + uu + vu,
      v + uv + vv, c2);
}